

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# listing.cpp
# Opt level: O3

void listing(char *lst_filename,list<ast::Statement_*,_std::allocator<ast::Statement_*>_> *ast_root)

{
  _List_node_base *p_Var1;
  size_t sVar2;
  ostream *poVar3;
  char *__s;
  _List_node_base *p_Var4;
  Statement *statement;
  ulong uVar5;
  string line;
  time_t now;
  ofstream lst;
  char *local_288;
  long local_280;
  char local_278 [16];
  _List_node_base *local_268;
  char *local_260;
  long local_258;
  char local_250 [16];
  _List_node_base *local_240;
  time_t local_238;
  long local_230;
  filebuf local_228 [240];
  ios_base local_138 [264];
  
  local_268 = (_List_node_base *)ast_root;
  std::ofstream::ofstream(&local_230,lst_filename,_S_out);
  local_238 = time((time_t *)0x0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_230,"P16 assembler v1.5 (Apr 27 2025)\t",0x21);
  if (lst_filename == (char *)0x0) {
    std::ios::clear((int)&local_288 + (int)*(undefined8 *)(local_230 + -0x18) + 0x58);
  }
  else {
    sVar2 = strlen(lst_filename);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,lst_filename,sVar2);
  }
  local_288 = (char *)CONCAT71(local_288._1_7_,9);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&local_230,(char *)&local_288,1);
  __s = ctime(&local_238);
  if (__s == (char *)0x0) {
    std::ios::clear((int)poVar3 + (int)*(undefined8 *)(*(long *)poVar3 + -0x18));
  }
  else {
    sVar2 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,__s,sVar2);
  }
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  ast::Sections::listing((ostream *)&local_230);
  ast::Symbols::listing((ostream *)&local_230);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"Code listing",0xc);
  std::ios::widen((char)(ostream *)&local_230 + (char)*(undefined8 *)(local_230 + -0x18));
  std::ostream::put((char)&local_230);
  std::ostream::flush();
  p_Var4 = (((_List_base<ast::Statement_*,_std::allocator<ast::Statement_*>_> *)&local_268->_M_next)
           ->_M_impl)._M_node.super__List_node_base._M_next;
  if (p_Var4 != local_268) {
    uVar5 = 1;
    do {
      p_Var1 = p_Var4[1]._M_next;
      local_288 = local_278;
      local_280 = 0;
      local_278[0] = '\0';
      local_240 = p_Var4;
      if ((int)uVar5 < *(int *)&p_Var1[3]._M_next) {
        uVar5 = (ulong)(int)uVar5;
        do {
          std::__cxx11::string::_M_assign((string *)&local_288);
          poVar3 = ostream_printf((ostream *)&local_230,"%4d%11c\t",uVar5 & 0xffffffff,0x20);
          poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,local_288,local_280);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
          std::ostream::put((char)poVar3);
          std::ostream::flush();
          uVar5 = uVar5 + 1;
        } while ((long)uVar5 < (long)*(int *)&p_Var1[3]._M_next);
      }
      std::__cxx11::string::_M_assign((string *)&local_288);
      (**(code **)((long)p_Var1->_M_next + 0x20))(&local_260,p_Var1);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&local_230,local_260,local_258);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,local_288,local_280);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
      std::ostream::put((char)poVar3);
      std::ostream::flush();
      if (local_260 != local_250) {
        operator_delete(local_260);
      }
      (**(code **)((long)p_Var1->_M_next + 0x28))(&local_260,p_Var1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,local_260,local_258);
      if (local_260 != local_250) {
        operator_delete(local_260);
      }
      if (local_288 != local_278) {
        operator_delete(local_288);
      }
      uVar5 = (ulong)((int)uVar5 + 1);
      p_Var4 = (((_List_base<ast::Statement_*,_std::allocator<ast::Statement_*>_> *)
                &local_240->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
    } while (p_Var4 != local_268);
  }
  std::ofstream::close();
  local_230 = _VTT;
  *(undefined8 *)(local_228 + *(long *)(_VTT + -0x18) + -8) = _memcpy;
  std::filebuf::~filebuf(local_228);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

void listing(const char *lst_filename, std::list<Statement*> *ast_root)
{
	try {
		std::ofstream lst (lst_filename);
		int current_line = 1;
		std::time_t now = std::time(0);
		lst << "P16 assembler v" VERSION " (" __DATE__ ")\t"
			<< lst_filename << '\t' << ctime(&now) << endl;

		Sections::listing(lst);
		Symbols::listing(lst);

		lst << "Code listing" << endl;
		for (auto s: *ast_root) {
			Statement *statement = s;
			std::string line;
			for (; current_line < statement->location.line; ++current_line) {
			//	linhas em branco e comentários
				line = srcfile[current_line - 1];
				ostream_printf(lst, "%4d%11c\t", current_line, ' ') << line << endl;
			}
			line = srcfile[current_line - 1];
			lst << statement->listing() << line << endl;
			lst << statement->more_listing();
			current_line++;
		}
		lst.close();
	} catch (std::ios_base::failure& e) {
		std::cerr << "IO exception: " << e.what() << endl;
	}
}